

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

void __thiscall rapidxml::xml_node<char>::append_node(xml_node<char> *this,xml_node<char> *child)

{
  xml_node<char> *pxVar1;
  xml_node<char> **ppxVar2;
  
  if (((child != (xml_node<char> *)0x0) &&
      ((child->super_xml_base<char>).m_parent == (xml_node<char> *)0x0)) &&
     (child->m_type != node_document)) {
    if (this->m_first_node == (xml_node<char> *)0x0) {
      ppxVar2 = &this->m_first_node;
      child->m_prev_sibling = (xml_node<char> *)0x0;
    }
    else {
      pxVar1 = this->m_last_node;
      child->m_prev_sibling = pxVar1;
      ppxVar2 = &pxVar1->m_next_sibling;
    }
    *ppxVar2 = child;
    this->m_last_node = child;
    (child->super_xml_base<char>).m_parent = this;
    child->m_next_sibling = (xml_node<char> *)0x0;
    return;
  }
  __assert_fail("child && !child->parent() && child->type() != node_document",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/rapidxml/rapidxml.hpp"
                ,1099,"void rapidxml::xml_node<>::append_node(xml_node<Ch> *) [Ch = char]");
}

Assistant:

void append_node(xml_node<Ch> *child)
        {
            assert(child && !child->parent() && child->type() != node_document);
            if (first_node())
            {
                child->m_prev_sibling = m_last_node;
                m_last_node->m_next_sibling = child;
            }
            else
            {
                child->m_prev_sibling = 0;
                m_first_node = child;
            }
            m_last_node = child;
            child->m_parent = this;
            child->m_next_sibling = 0;
        }